

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O3

int __thiscall vmbt_lcg_ifc::rand(vmbt_lcg_ifc *this)

{
  *this->seedp = *this->seedp * 0x19660d + 1;
  return *this->seedp;
}

Assistant:

virtual uint32_t rand()
    {
        const uint32_t a = 1664525L;
        const uint32_t c = 1;

        /* 
         *   Generate the next random value using the linear congruential
         *   method described in Knuth, The Art of Computer Programming,
         *   volume 2, p170.
         *   
         *   Use 2^32 as m, hence (n mod m) == (n & 0xFFFFFFFF).  This is
         *   efficient and is well-suited to 32-bit machines, works fine on
         *   larger machines, and will even work on 16-bit machines as long
         *   as the compiler can provide us with 32-bit arithmetic (which we
         *   assume extensively elsewhere anyway).
         *   
         *   We use a = 1664525, a multiplier which has very good results
         *   with the Spectral Test (see Knuth p102) with our choice of m.
         *   
         *   Use c = 1, since this trivially satisfies Knuth's requirements
         *   about common factors.
         *   
         *   Note that the result of the multiplication might overflow a
         *   32-bit ulong for values of lcg_rand_seed that are not small.
         *   This doesn't matter, since if it does, the machine will
         *   naturally truncate high-order bits to yield the result mod 2^32.
         *   So, on a 32-bit machine, the (&0xFFFFFFFF) part is superfluous,
         *   but it's harmless and is needed for machines with a larger word
         *   size.  
         */
        *seedp = (int32_t)(((a * (uint32_t)*seedp) + c) & 0xFFFFFFFF);
        return (uint32_t)*seedp;
    }